

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DeferredFailIfNotUnicode
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  code *pcVar1;
  bool bVar2;
  CharCount pos;
  CharCount encodedPos;
  undefined4 *puVar3;
  ParseError *this_00;
  
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x249,"(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                       "this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->deferredIfNotUnicodeError == (ParseError *)0x0) {
    this_00 = (ParseError *)new<Memory::ArenaAllocator>(0x10,this->ctAllocator,0x35916e);
    bVar2 = this->inBody;
    pos = Pos(this);
    encodedPos = Chars<unsigned_char>::OSB(this->next,this->input);
    ParseError::ParseError(this_00,bVar2,pos,encodedPos,error);
    this->deferredIfNotUnicodeError = this_00;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DeferredFailIfNotUnicode(HRESULT error)
    {
        Assert(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
        if (this->deferredIfNotUnicodeError == nullptr)
        {
            this->deferredIfNotUnicodeError = Anew(ctAllocator, ParseError, inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
        }
    }